

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O3

Dar_Cut_t * Dar_ObjPrepareCuts(Dar_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Dar_Cut_t *__s;
  undefined1 *puVar4;
  void **ppvVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("Dar_ObjCuts(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2a0,"Dar_Cut_t *Dar_ObjPrepareCuts(Dar_Man_t *, Aig_Obj_t *)");
  }
  pObj->field_0x1f = (char)p->pPars->nCutsMax;
  __s = (Dar_Cut_t *)Aig_MmFixedEntryFetch(p->pMemCuts);
  memset(__s,0,(long)p->pPars->nCutsMax * 0x18);
  if ((*(ulong *)&pObj->field_0x18 & 7) == 0) {
    __assert_fail("!Aig_ObjIsNone(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darInt.h"
                  ,0x6c,"void Dar_ObjSetCuts(Aig_Obj_t *, Dar_Cut_t *)");
  }
  (pObj->field_5).pData = __s;
  if (0xffffffffffffff < *(ulong *)&pObj->field_0x18) {
    puVar4 = &__s->field_0x4;
    uVar6 = 0;
    do {
      puVar4[3] = puVar4[3] & 0xef;
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 0x18;
    } while (uVar6 < (byte)pObj->field_0x1f);
  }
  pVVar1 = p->vCutNodes;
  uVar6 = pVVar1->nSize;
  if (uVar6 == pVVar1->nCap) {
    if ((int)uVar6 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar5;
      pVVar1->nCap = 0x10;
    }
    else {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar1->pArray,(ulong)uVar6 << 4);
      }
      pVVar1->pArray = ppvVar5;
      pVVar1->nCap = uVar6 * 2;
    }
  }
  else {
    ppvVar5 = pVVar1->pArray;
  }
  iVar7 = pVVar1->nSize;
  pVVar1->nSize = iVar7 + 1;
  ppvVar5[iVar7] = pObj;
  uVar6 = *(uint *)&__s->field_0x4;
  *(uint *)&__s->field_0x4 = uVar6 | 0x10000000;
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 1) {
    uVar6 = uVar6 & 0x1fff0000 | 0x1000ffff;
    uVar8 = 0;
  }
  else {
    *(uint *)&__s->field_0x4 = uVar6 & 0x1fffffff | 0x30000000;
    uVar8 = 1 << ((byte)pObj->Id & 0x1f);
    __s->pLeaves[0] = pObj->Id;
    uVar6 = uVar6 & 0x1fff0000 | 0x3000aaaa;
  }
  __s->uSign = uVar8;
  *(uint *)&__s->field_0x4 = uVar6;
  if ((uVar6 >> 0x1c & 1) == 0) {
    __assert_fail("pCut->fUsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x6e,"int Dar_CutFindValue(Dar_Man_t *, Dar_Cut_t *)");
  }
  uVar8 = 0x3e90000;
  if (0x1fffffff < uVar6) {
    pVVar1 = p->pAig->vObjs;
    if (pVVar1 == (Vec_Ptr_t *)0x0) {
      uVar8 = 0;
    }
    else {
      iVar7 = __s->pLeaves[0];
      if (((long)iVar7 < 0) || (pVVar1->nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar8 = 0x3e90000;
      if (pVVar1->pArray[iVar7] == (void *)0x0) {
        uVar8 = 0;
      }
    }
  }
  *(uint *)&__s->field_0x4 = uVar6 & 0x3800ffff | uVar8;
  iVar7 = p->nCutMemUsed;
  iVar2 = Aig_MmFixedReadMemUsage(p->pMemCuts);
  iVar3 = iVar2 + 0xfffff;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  if (iVar7 < iVar3 >> 0x14) {
    iVar3 = Aig_MmFixedReadMemUsage(p->pMemCuts);
    iVar7 = iVar3 + 0xfffff;
    if (-1 < iVar3) {
      iVar7 = iVar3;
    }
    p->nCutMemUsed = iVar7 >> 0x14;
  }
  return __s;
}

Assistant:

Dar_Cut_t * Dar_ObjPrepareCuts( Dar_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutSet, * pCut;
    int i;
    assert( Dar_ObjCuts(pObj) == NULL );
    pObj->nCuts = p->pPars->nCutsMax;
    // create the cutset of the node
    pCutSet = (Dar_Cut_t *)Aig_MmFixedEntryFetch( p->pMemCuts );
    memset( pCutSet, 0, p->pPars->nCutsMax * sizeof(Dar_Cut_t) );
    Dar_ObjSetCuts( pObj, pCutSet );
    Dar_ObjForEachCutAll( pObj, pCut, i )
        pCut->fUsed = 0;
    Vec_PtrPush( p->vCutNodes, pObj );
    // add unit cut if needed
    pCut = pCutSet;
    pCut->fUsed = 1;
    if ( Aig_ObjIsConst1(pObj) )
    {
        pCut->nLeaves = 0;
        pCut->uSign = 0;
        pCut->uTruth = 0xFFFF;
    }
    else
    {
        pCut->nLeaves = 1;
        pCut->pLeaves[0] = pObj->Id;
        pCut->uSign = Aig_ObjCutSign( pObj->Id );
        pCut->uTruth = 0xAAAA;
    }
    pCut->Value = Dar_CutFindValue( p, pCut );
    if ( p->nCutMemUsed < Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) )
        p->nCutMemUsed = Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20);
    return pCutSet;
}